

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseGlobalType(WastParser *this,Global *global)

{
  bool bVar1;
  Result RVar2;
  char *pcVar3;
  int __c;
  int __c_00;
  Var *pVVar4;
  long lVar5;
  allocator<char> local_104;
  allocator<char> local_103;
  allocator<char> local_102;
  allocator<char> local_101;
  Var type_1;
  string local_a0 [32];
  Var type;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  bVar1 = MatchLpar(this,Mut);
  if (bVar1) {
    global->mutable_ = true;
    pVVar4 = &type;
    Var::Var(pVVar4);
    RVar2 = ParseValueType(this,pVVar4);
    if (RVar2.enum_ != Error) {
      pcVar3 = Var::index(&type,(char *)pVVar4,__c);
      global->type = (Type)((ulong)pcVar3 | 0xffffffff00000000);
      std::__cxx11::string::string<std::allocator<char>>((string *)&type_1,"i32",&local_101);
      std::__cxx11::string::string<std::allocator<char>>((string *)&type_1.type_,"i64",&local_102);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)((long)&type_1.field_2 + 0x18),"f32",&local_103);
      std::__cxx11::string::string<std::allocator<char>>(local_a0,"f64",&local_104);
      local_38 = 0;
      uStack_30 = 0;
      local_28 = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_initialize<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_38,
                 &type_1,&type);
      RVar2 = ErrorIfLpar(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&local_38,(char *)0x0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_38);
      lVar5 = 0x60;
      do {
        std::__cxx11::string::_M_dispose();
        lVar5 = lVar5 + -0x20;
      } while (lVar5 != -0x20);
      if (RVar2.enum_ != Error) {
        RVar2 = Expect(this,Rpar);
        Var::~Var(&type);
        if (RVar2.enum_ == Error) {
          return (Result)Error;
        }
        return (Result)Ok;
      }
    }
    pVVar4 = &type;
  }
  else {
    pVVar4 = &type_1;
    Var::Var(pVVar4);
    RVar2 = ParseValueType(this,pVVar4);
    if (RVar2.enum_ != Error) {
      pcVar3 = Var::index(&type_1,(char *)pVVar4,__c_00);
      global->type = (Type)((ulong)pcVar3 | 0xffffffff00000000);
      Var::~Var(&type_1);
      return (Result)Ok;
    }
    pVVar4 = &type_1;
  }
  Var::~Var(pVVar4);
  return (Result)Error;
}

Assistant:

Result WastParser::ParseGlobalType(Global* global) {
  WABT_TRACE(ParseGlobalType);
  if (MatchLpar(TokenType::Mut)) {
    global->mutable_ = true;
    Var type;
    CHECK_RESULT(ParseValueType(&type));
    global->type = Type(type.index());
    CHECK_RESULT(ErrorIfLpar({"i32", "i64", "f32", "f64"}));
    EXPECT(Rpar);
  } else {
    Var type;
    CHECK_RESULT(ParseValueType(&type));
    global->type = Type(type.index());
  }

  return Result::Ok;
}